

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  string *psVar3;
  ostream *poVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmGeneratedFileStream fout;
  long *local_310 [2];
  long local_300 [2];
  undefined8 local_2f0;
  undefined1 *puStack_2e8;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined1 *local_2b8;
  undefined1 local_2b0 [32];
  undefined1 local_290 [24];
  undefined1 *puStack_278;
  byte local_270 [8];
  long *local_268;
  undefined8 local_260;
  undefined1 *local_258;
  size_type local_250;
  pointer local_248;
  undefined8 local_240;
  char *local_238;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  pp_Var2 = (_func_int **)psVar3->_M_string_length;
  puStack_2e8 = local_2e0;
  local_2f0 = 1;
  local_2e0[0] = 0x2f;
  (*lg->_vptr_cmLocalGenerator[0xe])(local_310,lg,target);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_290._16_8_ = local_2f0;
  puStack_278 = puStack_2e8;
  local_270 = (byte  [8])local_310[1];
  local_268 = local_310[0];
  local_2b8 = local_2b0;
  local_2c0 = 1;
  local_2b0[0] = 0x2f;
  local_260 = 1;
  local_248 = (psVar3->_M_dataplus)._M_p;
  local_250 = psVar3->_M_string_length;
  local_240 = 7;
  local_238 = ".objlib";
  views._M_len = 6;
  views._M_array = (iterator)local_290;
  local_290._0_8_ = pp_Var2;
  local_290._8_8_ = pcVar1;
  local_258 = local_2b8;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,__return_storage_ptr__,false,None);
  if ((local_270[(long)*(_func_int **)(local_290._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290,"# This is a dummy file for the OBJECT library ",0x2e);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_290,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," for the CMake CodeBlocks project generator.\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# Don\'t edit, this file will be overwritten.\n",0x2d);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(target), '/',
                                  target->GetName(), ".objlib");
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}